

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  char cVar1;
  int iVar2;
  xmlParserErrors code;
  xmlCharEncodingHandlerPtr pxStack_30;
  int res;
  xmlCharEncodingHandlerPtr handler;
  int local_20;
  int autoFlag;
  int bomSize;
  xmlCharEncoding enc;
  xmlChar *in;
  xmlParserCtxtPtr ctxt_local;
  
  handler._4_4_ = 0;
  in = (xmlChar *)ctxt;
  iVar2 = xmlParserGrow(ctxt);
  if ((-1 < iVar2) &&
     (_bomSize = *(char **)(*(long *)(in + 0x38) + 0x20),
     3 < *(long *)(*(long *)(in + 0x38) + 0x28) - (long)_bomSize)) {
    if ((*(uint *)(*(long *)(in + 0x38) + 0x60) & 1) == 0) {
      autoFlag = 0;
      local_20 = 0;
      cVar1 = *_bomSize;
      if (cVar1 == '\0') {
        if ((((*(int *)(in + 0x34) == 0) && (_bomSize[1] == '\0')) && (_bomSize[2] == '\0')) &&
           (_bomSize[3] == '<')) {
          autoFlag = 5;
          handler._4_4_ = 8;
        }
        else if (((_bomSize[1] == '<') && (_bomSize[2] == '\0')) && (_bomSize[3] == '?')) {
          autoFlag = 3;
          handler._4_4_ = 6;
        }
      }
      else if (cVar1 == '<') {
        if (_bomSize[1] == '\0') {
          if (((*(int *)(in + 0x34) == 0) && (_bomSize[2] == '\0')) && (_bomSize[3] == '\0')) {
            autoFlag = 4;
            handler._4_4_ = 8;
          }
          else if ((_bomSize[2] == '?') && (_bomSize[3] == '\0')) {
            autoFlag = 2;
            handler._4_4_ = 4;
          }
        }
      }
      else if (cVar1 == 'L') {
        if ((((*(int *)(in + 0x34) == 0) && (_bomSize[1] == 'o')) && (_bomSize[2] == -0x59)) &&
           (_bomSize[3] == -0x6c)) {
          autoFlag = 6;
          handler._4_4_ = 8;
        }
      }
      else if (cVar1 == -0x11) {
        if ((_bomSize[1] == -0x45) && (_bomSize[2] == -0x41)) {
          autoFlag = 1;
          handler._4_4_ = 2;
          local_20 = 3;
        }
      }
      else if (cVar1 == -2) {
        if (_bomSize[1] == -1) {
          autoFlag = 3;
          handler._4_4_ = 6;
          local_20 = 2;
        }
      }
      else if ((cVar1 == -1) && (_bomSize[1] == -2)) {
        autoFlag = 2;
        handler._4_4_ = 4;
        local_20 = 2;
      }
      if (local_20 != 0) {
        *(long *)(*(long *)(in + 0x38) + 0x20) =
             *(long *)(*(long *)(in + 0x38) + 0x20) + (long)local_20;
      }
      if (autoFlag != 0) {
        *(uint *)(*(long *)(in + 0x38) + 0x60) =
             handler._4_4_ | *(uint *)(*(long *)(in + 0x38) + 0x60);
        if (autoFlag == 6) {
          code = xmlDetectEBCDIC((xmlParserCtxtPtr)in,&stack0xffffffffffffffd0);
          if (code == XML_ERR_OK) {
            xmlSwitchToEncoding((xmlParserCtxtPtr)in,pxStack_30);
          }
          else {
            xmlFatalErr((xmlParserCtxtPtr)in,code,"detecting EBCDIC\n");
          }
        }
        else {
          xmlSwitchEncoding((xmlParserCtxtPtr)in,autoFlag);
        }
      }
    }
    else if (((*_bomSize == -0x11) && (_bomSize[1] == -0x45)) && (_bomSize[2] == -0x41)) {
      *(long *)(*(long *)(in + 0x38) + 0x20) = *(long *)(*(long *)(in + 0x38) + 0x20) + 3;
    }
  }
  return;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            int res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}